

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

SetLogLevelError emulator_set_log_level_from_string(char *s)

{
  int iVar1;
  LogLevel level;
  char *pcVar2;
  char *__s;
  size_t __n;
  char *name;
  int i;
  LogSystem system;
  char *equals;
  char *log_system_name;
  char *s_local;
  
  pcVar2 = strchr(s,0x3d);
  if (pcVar2 == (char *)0x0) {
    s_local._4_4_ = SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }
  else {
    name._4_4_ = NUM_LOG_SYSTEMS;
    for (name._0_4_ = LOG_SYSTEM_A; (int)(LogSystem)name < 6;
        name._0_4_ = (LogSystem)name + LOG_SYSTEM_H) {
      __s = emulator_get_log_system_name((LogSystem)name);
      __n = strlen(__s);
      iVar1 = strncmp(s,__s,__n);
      if (iVar1 == 0) {
        name._4_4_ = (LogSystem)name;
        break;
      }
    }
    if (name._4_4_ == NUM_LOG_SYSTEMS) {
      s_local._4_4_ = SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
    }
    else {
      level = atoi(pcVar2 + 1);
      emulator_set_log_level(name._4_4_,level);
      s_local._4_4_ = SET_LOG_LEVEL_ERROR_NONE;
    }
  }
  return s_local._4_4_;
}

Assistant:

SetLogLevelError emulator_set_log_level_from_string(const char* s) {
  const char* log_system_name = s;
  const char* equals = strchr(s, '=');
  if (!equals) {
    return SET_LOG_LEVEL_ERROR_INVALID_FORMAT;
  }

  LogSystem system = NUM_LOG_SYSTEMS;
  int i;
  for (i = 0; i < NUM_LOG_SYSTEMS; ++i) {
    const char* name = emulator_get_log_system_name(i);
    if (strncmp(log_system_name, name, strlen(name)) == 0) {
      system = i;
      break;
    }
  }

  if (system == NUM_LOG_SYSTEMS) {
    return SET_LOG_LEVEL_ERROR_UNKNOWN_LOG_SYSTEM;
  }

  emulator_set_log_level(system, atoi(equals + 1));
  return SET_LOG_LEVEL_ERROR_NONE;
}